

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

Lit __thiscall Minisat::SimpSolver::subsumes(SimpSolver *this,Clause *c1,Clause *c2)

{
  uint64_t *puVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)c1->header >> 0x22;
  uVar7 = (ulong)c2->header >> 0x22;
  iVar5 = -1;
  if ((uVar6 <= uVar7) &&
     ((*(uint *)(&c1[1].header.field_0x0 + uVar6 * 4) &
      ~*(uint *)(&c2[1].header.field_0x0 + uVar7 * 4)) == 0)) {
    puVar1 = &(this->super_Solver).counter;
    *puVar1 = *puVar1 + 1;
    if ((ulong)c2->header >> 0x22 != 0) {
      puVar3 = (this->super_Solver).seen2.data;
      uVar6 = 0;
      do {
        puVar3[*(int *)(&c2[1].header.field_0x0 + uVar6 * 4)] = (this->super_Solver).counter;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)c2->header >> 0x22);
    }
    iVar5 = -2;
    if (0x3ffffffff < (ulong)c1->header) {
      puVar3 = (this->super_Solver).seen2.data;
      uVar4 = (this->super_Solver).counter;
      iVar5 = -2;
      uVar6 = 0;
      do {
        iVar2 = *(int *)(&c1[1].header.field_0x0 + uVar6 * 4);
        if ((puVar3[iVar2] != uVar4) &&
           ((iVar5 != -2 || (iVar5 = iVar2, puVar3[(long)iVar2 ^ 1] != uVar4)))) {
          iVar5 = -1;
        }
        uVar6 = uVar6 + 1;
      } while ((ulong)c1->header >> 0x22 != uVar6);
    }
  }
  return (Lit)iVar5;
}

Assistant:

int size() const { return header.size; }